

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void dns_handler(mg_connection *nc,int ev,void *ev_data)

{
  ushort uVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  uint16_t len;
  undefined8 local_c48;
  undefined4 local_c40;
  mg_dns_message local_c38;
  
  (*nc->handler)(nc,ev,ev_data);
  if (ev == 3) {
    uVar3 = (nc->recv_mbuf).len;
    if (1 < uVar3 && (nc->flags & 2) == 0) {
      __dest = (nc->recv_mbuf).buf;
      memmove(__dest,__dest + 2,uVar3 - 2);
      uVar3 = (nc->recv_mbuf).len - 2;
      (nc->recv_mbuf).len = uVar3;
    }
    iVar2 = mg_parse_dns((nc->recv_mbuf).buf,(int)uVar3,&local_c38);
    if (iVar2 == -1) {
      local_c40 = 0;
      local_c48 = 0x81800000;
      mbuf_insert(&nc->recv_mbuf,0,&local_c48,0xc);
      if ((nc->flags & 2) == 0) {
        uVar1 = (ushort)(nc->recv_mbuf).len;
        local_c48 = CONCAT62(local_c48._2_6_,uVar1 << 8 | uVar1 >> 8);
        mbuf_insert(&nc->recv_mbuf,0,&local_c48,2);
      }
      mg_send(nc,(nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len);
    }
    else {
      (*nc->handler)(nc,100,&local_c38);
    }
    if ((nc->recv_mbuf).len != 0) {
      (nc->recv_mbuf).len = 0;
    }
  }
  return;
}

Assistant:

static void dns_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct mbuf *io = &nc->recv_mbuf;
    struct mg_dns_message msg;

    /* Pass low-level events to the user handler */
    nc->handler(nc, ev, ev_data);

    switch (ev) {
        case MG_EV_RECV:
            if (!(nc->flags & MG_F_UDP)) {
                mbuf_remove(&nc->recv_mbuf, 2);
            }
            if (mg_parse_dns(nc->recv_mbuf.buf, nc->recv_mbuf.len, &msg) == -1) {
                /* reply + recursion allowed + format error */
                memset(&msg, 0, sizeof(msg));
                msg.flags = 0x8081;
                mg_dns_insert_header(io, 0, &msg);
                if (!(nc->flags & MG_F_UDP)) {
                    uint16_t len = htons(io->len);
                    mbuf_insert(io, 0, &len, 2);
                }
                mg_send(nc, io->buf, io->len);
            } else {
                /* Call user handler with parsed message */
                nc->handler(nc, MG_DNS_MESSAGE, &msg);
            }
            mbuf_remove(io, io->len);
            break;
    }
}